

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aalcalcmeanonly.cpp
# Opt level: O2

void aalcalcmeanonly::LoadOccurrence(void)

{
  FILE *__stream;
  int dateOpts;
  occurrence occ;
  
  __stream = fopen("input/occurrence.bin","rb");
  if (__stream != (FILE *)0x0) {
    fread(&dateOpts,4,1,__stream);
    if ((uint)dateOpts < 2) {
      LoadOccurrence<occurrence>(&occ,(FILE *)__stream);
    }
    else {
      LoadOccurrence<occurrence_granular>((occurrence_granular *)&occ,(FILE *)__stream);
    }
    return;
  }
  fprintf(_stderr,"FATAL: %s: cannot open %s\n","LoadOccurrence","input/occurrence.bin");
  exit(1);
}

Assistant:

void LoadOccurrence() {

    int dateOpts;
    int granularDate = 0;
    FILE *fin = fopen(OCCURRENCE_FILE, "rb");
    if (fin == nullptr) {
      fprintf(stderr, "FATAL: %s: cannot open %s\n", __func__, OCCURRENCE_FILE);
      exit(EXIT_FAILURE);
    }

    fread(&dateOpts, sizeof(dateOpts), 1, fin);
    granularDate = dateOpts >> 1;
    if (granularDate) {
      occurrence_granular occ;
      LoadOccurrence(occ, fin);
    } else {
      occurrence occ;
      LoadOccurrence(occ, fin);
    }

  }